

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list.cpp
# Opt level: O0

void sqlcheck::CheckForeignKeyExists
               (Configuration *state,string *sql_statement,bool *print_statement)

{
  char *pcVar1;
  bool bVar2;
  allocator local_c9;
  string local_c8;
  string local_a8;
  char *local_88;
  char *message;
  PatternType pattern_type;
  allocator local_69;
  string local_68 [8];
  string title;
  regex pattern;
  bool create_statement;
  bool *print_statement_local;
  string *sql_statement_local;
  Configuration *state_local;
  
  bVar2 = IsCreateStatement(sql_statement);
  if (bVar2) {
    std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex
              ((basic_regex<char,_std::__cxx11::regex_traits<char>_> *)((long)&title.field_2 + 8),
               "(foreign key)",0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_68,"Foreign Key Does Not Exist",&local_69);
    std::allocator<char>::~allocator((allocator<char> *)&local_69);
    message._0_4_ = 2;
    local_88 = anon_var_dwarf_90089;
    std::__cxx11::string::string((string *)&local_a8,local_68);
    pcVar1 = local_88;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_c8,pcVar1,&local_c9);
    CheckPattern(state,sql_statement,print_statement,(regex *)((long)&title.field_2 + 8),
                 RISK_LEVEL_MEDIUM,PATTERN_TYPE_LOGICAL_DATABASE_DESIGN,&local_a8,&local_c8,false,0)
    ;
    std::__cxx11::string::~string((string *)&local_c8);
    std::allocator<char>::~allocator((allocator<char> *)&local_c9);
    std::__cxx11::string::~string((string *)&local_a8);
    std::__cxx11::string::~string(local_68);
    std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex
              ((basic_regex<char,_std::__cxx11::regex_traits<char>_> *)((long)&title.field_2 + 8));
  }
  return;
}

Assistant:

void CheckForeignKeyExists(Configuration& state,
                           const std::string& sql_statement,
                           bool& print_statement){

  auto create_statement = IsCreateStatement(sql_statement);
  if(create_statement == false){
    return;
  }

  std::regex pattern("(foreign key)");
  std::string title = "Foreign Key Does Not Exist";
  PatternType pattern_type = PatternType::PATTERN_TYPE_LOGICAL_DATABASE_DESIGN;

  auto message =
      "● Consider adding a foreign key:  "
      "Are you leaving out the application constraints? Even though it seems at "
      "first that skipping foreign key constraints makes your database design "
      "simpler, more flexible, or speedier, you pay for this in other ways. "
      "It becomes your responsibility to write code to ensure referential integrity "
      "manually. Use foreign key constraints to enforce referential integrity. "
      "Foreign keys have another feature you can’t mimic using application code:  "
      "cascading updates to multiple tables. This feature allows you to "
      "update or delete the parent row and lets the database takes care of any child "
      "rows that reference it. The way you declare the ON UPDATE or ON DELETE clauses "
      "in the foreign key constraint allow you to control the result of a cascading "
      "operation. Make your database mistake-proof with constraints.";

  CheckPattern(state,
               sql_statement,
               print_statement,
               pattern,
               RISK_LEVEL_MEDIUM,
               pattern_type,
               title,
               message,
               false);

}